

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O2

void google::protobuf::compiler::cpp::anon_unknown_3::InitMethodVariables
               (MethodDescriptor *method,Options *options,Formatter *format)

{
  Descriptor *pDVar1;
  Options *in_RCX;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_58,"name",(allocator *)&local_38);
  Formatter::Set<std::__cxx11::string>
            (format,&local_58,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)method);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"input_type",&local_59);
  pDVar1 = MethodDescriptor::input_type(method);
  QualifiedClassName_abi_cxx11_(&local_38,(cpp *)pDVar1,(Descriptor *)options,in_RCX);
  Formatter::Set<std::__cxx11::string>(format,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"output_type",&local_59);
  pDVar1 = MethodDescriptor::output_type(method);
  QualifiedClassName_abi_cxx11_(&local_38,(cpp *)pDVar1,(Descriptor *)options,in_RCX);
  Formatter::Set<std::__cxx11::string>(format,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void InitMethodVariables(const MethodDescriptor* method, const Options& options,
                         Formatter* format) {
  format->Set("name", method->name());
  format->Set("input_type", QualifiedClassName(method->input_type(), options));
  format->Set("output_type",
              QualifiedClassName(method->output_type(), options));
}